

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress1X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  DTableDesc DVar3;
  uint uVar4;
  BIT_DStream_status BVar5;
  uint uVar6;
  undefined1 *puVar7;
  size_t sVar8;
  int bmi2_local;
  HUF_DTable *DTable_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  size_t err_;
  U32 dtLog;
  DTableDesc dtd;
  BIT_DStream_t bitD;
  HUF_DEltX1 *dt;
  void *dtPtr;
  BYTE *oend;
  BYTE *op;
  size_t local_130;
  BYTE *pStart;
  undefined1 *local_100;
  BYTE c;
  size_t val;
  BYTE c_2;
  size_t val_2;
  BYTE c_3;
  size_t val_3;
  BYTE c_1;
  size_t val_1;
  BYTE c_4;
  size_t val_4;
  BYTE c_5;
  size_t val_5;
  
  puVar7 = (undefined1 *)((long)dst + dstSize);
  DVar3 = HUF_getDTableDesc(DTable);
  uVar6 = (uint)DVar3 >> 0x10 & 0xff;
  local_130 = BIT_initDStream((BIT_DStream_t *)&dtLog,cSrc,cSrcSize);
  uVar4 = ERR_isError(local_130);
  if (uVar4 == 0) {
    local_100 = (undefined1 *)dst;
    while (BVar5 = BIT_reloadDStream((BIT_DStream_t *)&dtLog),
          BVar5 == BIT_DStream_unfinished && local_100 < puVar7 + -3) {
      uVar4 = MEM_64bits();
      if (uVar4 != 0) {
        sVar8 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar6);
        uVar1 = *(undefined1 *)((long)DTable + sVar8 * 2 + 4);
        BIT_skipBits((BIT_DStream_t *)&dtLog,(uint)*(byte *)((long)DTable + sVar8 * 2 + 5));
        *local_100 = uVar1;
        local_100 = local_100 + 1;
      }
      MEM_64bits();
      sVar8 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar6);
      uVar1 = *(undefined1 *)((long)DTable + sVar8 * 2 + 4);
      BIT_skipBits((BIT_DStream_t *)&dtLog,(uint)*(byte *)((long)DTable + sVar8 * 2 + 5));
      *local_100 = uVar1;
      uVar4 = MEM_64bits();
      puVar2 = local_100 + 1;
      if (uVar4 != 0) {
        sVar8 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar6);
        uVar1 = *(undefined1 *)((long)DTable + sVar8 * 2 + 4);
        BIT_skipBits((BIT_DStream_t *)&dtLog,(uint)*(byte *)((long)DTable + sVar8 * 2 + 5));
        local_100[1] = uVar1;
        puVar2 = local_100 + 2;
      }
      local_100 = puVar2;
      sVar8 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar6);
      uVar1 = *(undefined1 *)((long)DTable + sVar8 * 2 + 4);
      BIT_skipBits((BIT_DStream_t *)&dtLog,(uint)*(byte *)((long)DTable + sVar8 * 2 + 5));
      *local_100 = uVar1;
      local_100 = local_100 + 1;
    }
    uVar4 = MEM_32bits();
    if (uVar4 != 0) {
      while (BVar5 = BIT_reloadDStream((BIT_DStream_t *)&dtLog),
            BVar5 == BIT_DStream_unfinished && local_100 < puVar7) {
        sVar8 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar6);
        uVar1 = *(undefined1 *)((long)DTable + sVar8 * 2 + 4);
        BIT_skipBits((BIT_DStream_t *)&dtLog,(uint)*(byte *)((long)DTable + sVar8 * 2 + 5));
        *local_100 = uVar1;
        local_100 = local_100 + 1;
      }
    }
    while (local_100 < puVar7) {
      sVar8 = BIT_lookBitsFast((BIT_DStream_t *)&dtLog,uVar6);
      uVar1 = *(undefined1 *)((long)DTable + sVar8 * 2 + 4);
      BIT_skipBits((BIT_DStream_t *)&dtLog,(uint)*(byte *)((long)DTable + sVar8 * 2 + 5));
      *local_100 = uVar1;
      local_100 = local_100 + 1;
    }
    uVar6 = BIT_endOfDStream((BIT_DStream_t *)&dtLog);
    local_130 = dstSize;
    if (uVar6 == 0) {
      local_130 = 0xffffffffffffffec;
    }
  }
  return local_130;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)
HUF_DGEN(HUF_decompress4X1_usingDTable_internal)



size_t HUF_decompress1X1_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 0) return ERROR(GENERIC);
    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}